

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_node_check_utf8(mpack_node_t node)

{
  _Bool _Var1;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar2;
  
  tree = node.tree;
  pmVar2 = node.data;
  if (tree->error != mpack_ok) {
    return;
  }
  if ((pmVar2->type == mpack_type_str) &&
     (_Var1 = mpack_utf8_check(tree->data + (long)(pmVar2->value).children,(ulong)pmVar2->len),
     _Var1)) {
    return;
  }
  mpack_tree_flag_error(tree,mpack_error_type);
  return;
}

Assistant:

void mpack_node_check_utf8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return;
    mpack_node_data_t* data = node.data;
    if (data->type != mpack_type_str || !mpack_utf8_check(mpack_node_data_unchecked(node), data->len))
        mpack_node_flag_error(node, mpack_error_type);
}